

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  char in_SIL;
  EState *in_RDI;
  EState *in_stack_00000050;
  EState *in_stack_000000c0;
  EState *in_stack_00000130;
  UInt32 in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  
  if (0 < in_RDI->nblock) {
    in_RDI->blockCRC = in_RDI->blockCRC ^ 0xffffffff;
    in_RDI->combinedCRC = in_RDI->combinedCRC << 1 | in_RDI->combinedCRC >> 0x1f;
    in_RDI->combinedCRC = in_RDI->blockCRC ^ in_RDI->combinedCRC;
    if (1 < in_RDI->blockNo) {
      in_RDI->numZ = 0;
    }
    if (1 < in_RDI->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n",
              (ulong)(uint)in_RDI->blockNo,(ulong)in_RDI->blockCRC,(ulong)in_RDI->combinedCRC,
              (ulong)(uint)in_RDI->nblock);
    }
    BZ2_blockSort(in_stack_00000050);
  }
  in_RDI->zbits = (UChar *)((long)in_RDI->arr2 + (long)in_RDI->nblock);
  if (in_RDI->blockNo == 1) {
    BZ2_bsInitWrite(in_RDI);
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
  }
  if (0 < in_RDI->nblock) {
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUInt32((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    bsW(in_RDI,1,0);
    bsW(in_RDI,0x18,in_RDI->origPtr);
    generateMTFValues(in_stack_00000130);
    sendMTFValues(in_stack_000000c0);
  }
  if (in_SIL != '\0') {
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUChar((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (UChar)(in_stack_ffffffffffffffec >> 0x18));
    bsPutUInt32((EState *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    if (1 < in_RDI->verbosity) {
      fprintf(_stderr,"    final combined CRC = 0x%08x\n   ",(ulong)in_RDI->combinedCRC);
    }
    bsFinishWrite(in_RDI);
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*--
         Now a single bit indicating (non-)randomisation.
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}